

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

void google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
               (size_t size,char *details)

{
  LogMessage *pLVar1;
  LogFinisher local_5d [13];
  LogMessage local_50;
  char *local_18;
  char *details_local;
  size_t size_local;
  
  local_18 = details;
  details_local = (char *)size;
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
             ,0x32);
  pLVar1 = internal::LogMessage::operator<<(&local_50,"size too big: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,(unsigned_long)details_local);
  pLVar1 = internal::LogMessage::operator<<(pLVar1," details: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,local_18);
  internal::LogFinisher::operator=(local_5d,pLVar1);
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void StringPiece::LogFatalSizeTooBig(size_t size, const char* details) {
  GOOGLE_LOG(FATAL) << "size too big: " << size << " details: " << details;
}